

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetEnumPath_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          EnumDescriptor *enum_descriptor)

{
  GeneratorOptions *options_00;
  Descriptor *file_descriptor;
  string *__rhs;
  Descriptor *in_R8;
  string local_40;
  GeneratorOptions *local_20;
  EnumDescriptor *enum_descriptor_local;
  GeneratorOptions *options_local;
  
  local_20 = options;
  enum_descriptor_local = (EnumDescriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  options_00 = (GeneratorOptions *)EnumDescriptor::file((EnumDescriptor *)options);
  file_descriptor = EnumDescriptor::containing_type((EnumDescriptor *)local_20);
  GetPrefix_abi_cxx11_(&local_40,this,options_00,(FileDescriptor *)file_descriptor,in_R8);
  __rhs = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)local_20);
  std::operator+(__return_storage_ptr__,&local_40,__rhs);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string GetEnumPath(const GeneratorOptions& options,
                   const EnumDescriptor* enum_descriptor) {
  return GetPrefix(
      options, enum_descriptor->file(),
      enum_descriptor->containing_type()) + enum_descriptor->name();
}